

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void rmd160(void *key,int len,uint32_t seed,void *out)

{
  uint in_EDX;
  unsigned_long in_RDI;
  
  rmd160_init((hash_state *)0x111741);
  ltc_state.rmd128.state[0] = in_EDX ^ 0x67452301;
  rmd160_process((hash_state *)CONCAT44(len,seed),(uchar *)out,in_RDI);
  rmd160_done((hash_state *)CONCAT44(len,seed),(uchar *)out);
  return;
}

Assistant:

inline void rmd160(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  rmd160_init(&ltc_state);
  ltc_state.rmd160.state[0] = 0x67452301UL ^ seed;
  rmd160_process(&ltc_state, (unsigned char *)key, len);
  rmd160_done(&ltc_state, (unsigned char *)out);
}